

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_BrepVertex * __thiscall
ON_ClassArray<ON_BrepVertex>::AppendNew(ON_ClassArray<ON_BrepVertex> *this)

{
  int iVar1;
  
  iVar1 = this->m_count;
  if (iVar1 == this->m_capacity) {
    iVar1 = NewCapacity(this);
    Reserve(this,(long)iVar1);
  }
  else {
    (*this->m_a[iVar1].super_ON_Point.super_ON_Geometry.super_ON_Object._vptr_ON_Object[3])
              (this->m_a + iVar1);
    ON_BrepVertex::ON_BrepVertex(this->m_a + this->m_count);
  }
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  return this->m_a + iVar1;
}

Assistant:

T& ON_ClassArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int newcapacity = NewCapacity();
    Reserve( newcapacity );
  }
  else
  {
    // First destroy what's there ..
    DestroyElement(m_a[m_count]);
    // and then get a properly initialized element
    ConstructDefaultElement(&m_a[m_count]);
  }
  return m_a[m_count++];
}